

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.h
# Opt level: O0

string * get_log_file(string *file_base)

{
  byte bVar1;
  __pid_t _Var2;
  ulong uVar3;
  ostream *poVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  string *in_RDI;
  string *filename_prefix;
  Logger *in_stack_fffffffffffffeb0;
  string *psVar9;
  int line;
  string *in_stack_ffffffffffffff28;
  LogSeverity in_stack_ffffffffffffff34;
  string local_b8 [16];
  string local_98 [38];
  undefined1 local_72;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  Logger local_14 [5];
  
  psVar9 = in_RDI;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    Logger::Logger(local_14,ERR);
    line = (int)((ulong)psVar9 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/system.h"
               ,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"get_log_file",&local_71);
    poVar4 = Logger::Start(in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,line,(string *)in_RDI
                          );
    poVar4 = std::operator<<(poVar4,"CHECK failed ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/system.h"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4a);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"!file_base.empty()");
    poVar4 = std::operator<<(poVar4," = ");
    bVar1 = std::__cxx11::string::empty();
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(bVar1 ^ 1));
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger(in_stack_fffffffffffffeb0);
    abort();
  }
  local_72 = 0;
  std::__cxx11::string::string(in_RDI);
  uVar5 = std::__cxx11::string::c_str();
  get_host_name_abi_cxx11_();
  uVar6 = std::__cxx11::string::c_str();
  get_user_name_abi_cxx11_();
  uVar7 = std::__cxx11::string::c_str();
  print_current_time_abi_cxx11_();
  uVar8 = std::__cxx11::string::c_str();
  _Var2 = getpid();
  SStringPrintf((string *)in_RDI,"%s.%s.%s.%s.%u",uVar5,uVar6,uVar7,uVar8,_Var2);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  return psVar9;
}

Assistant:

std::string get_log_file(const std::string& file_base) {
  CHECK(!file_base.empty());
  std::string filename_prefix;
  SStringPrintf(&filename_prefix,
                "%s.%s.%s.%s.%u",
                file_base.c_str(),
                get_host_name().c_str(),
                get_user_name().c_str(),
                print_current_time().c_str(),
                getpid());
  return filename_prefix;
}